

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphanage_tests.cpp
# Opt level: O3

bool __thiscall
orphanage_tests::EqualTxns
          (orphanage_tests *this,
          set<std::shared_ptr<const_CTransaction>,_std::less<std::shared_ptr<const_CTransaction>_>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          *set_txns,
          vector<std::pair<std::shared_ptr<const_CTransaction>,_long>,_std::allocator<std::pair<std::shared_ptr<const_CTransaction>,_long>_>_>
          *vec_txns)

{
  _Base_ptr p_Var1;
  bool bVar2;
  void *__pu;
  orphanage_tests *poVar3;
  orphanage_tests *poVar4;
  long in_FS_OFFSET;
  
  if (((long)vec_txns - (long)set_txns >> 3) * -0x5555555555555555 - *(long *)(this + 0x28) == 0) {
    bVar2 = true;
    if (set_txns !=
        (set<std::shared_ptr<const_CTransaction>,_std::less<std::shared_ptr<const_CTransaction>_>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
         *)vec_txns) {
      do {
        if (*(orphanage_tests **)(this + 0x10) == (orphanage_tests *)0x0) goto LAB_00502a08;
        p_Var1 = *(_Base_ptr *)set_txns;
        poVar3 = this + 8;
        poVar4 = *(orphanage_tests **)(this + 0x10);
        do {
          if (*(_Base_ptr *)(poVar4 + 0x20) >= p_Var1) {
            poVar3 = poVar4;
          }
          poVar4 = *(orphanage_tests **)
                    (poVar4 + (ulong)(*(_Base_ptr *)(poVar4 + 0x20) < p_Var1) * 8 + 0x10);
        } while (poVar4 != (orphanage_tests *)0x0);
        if ((poVar3 == this + 8) || (p_Var1 < *(_Base_ptr *)(poVar3 + 0x20))) goto LAB_00502a08;
        set_txns = (set<std::shared_ptr<const_CTransaction>,_std::less<std::shared_ptr<const_CTransaction>_>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                    *)((long)set_txns + 0x18);
      } while (set_txns !=
               (set<std::shared_ptr<const_CTransaction>,_std::less<std::shared_ptr<const_CTransaction>_>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                *)vec_txns);
    }
  }
  else {
LAB_00502a08:
    bVar2 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != *(long *)(in_FS_OFFSET + 0x28)) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

static bool EqualTxns(const std::set<CTransactionRef>& set_txns,
                      const std::vector<std::pair<CTransactionRef, NodeId>>& vec_txns)
{
    if (vec_txns.size() != set_txns.size()) return false;
    for (const auto& [tx, nodeid] : vec_txns) {
        if (!set_txns.contains(tx)) return false;
    }
    return true;
}